

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::Imputer::_InternalSerialize
          (Imputer *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  Int64Vector *this_00;
  StringToDoubleMap *this_01;
  Int64ToDoubleMap *this_02;
  void *data;
  bool bVar2;
  undefined8 *puVar3;
  uint8_t *puVar4;
  DoubleVector *pDVar5;
  ulong uVar6;
  ulong uVar7;
  string *psVar8;
  ulong uVar9;
  uint8_t *puVar10;
  size_t __n;
  ImputedValueUnion IVar11;
  ReplaceValueUnion RVar12;
  
  if (this->_oneof_case_[0] == 1) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (this->_oneof_case_[0] == 1) {
      IVar11 = this->ImputedValue_;
    }
    else {
      IVar11.imputeddoublevalue_ = 0.0;
    }
    *target = '\t';
    ((ImputedValueUnion *)(target + 1))->imputeddoublevalue_ = (double)IVar11;
    target = target + 9;
  }
  puVar10 = target;
  if (this->_oneof_case_[0] == 2) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (this->_oneof_case_[0] == 2) {
      pDVar5 = (this->ImputedValue_).imputeddoublearray_;
    }
    else {
      pDVar5 = (DoubleVector *)0x0;
    }
    *target = '\x10';
    target[1] = (byte)pDVar5;
    if (pDVar5 < (DoubleVector *)0x80) {
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)pDVar5 | 0x80;
      target[2] = (uint8_t)((ulong)pDVar5 >> 7);
      puVar10 = target + 3;
      if ((DoubleVector *)0x3fff < pDVar5) {
        uVar9 = (ulong)target[2];
        uVar6 = (ulong)pDVar5 >> 7;
        do {
          puVar10[-1] = (byte)uVar9 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar10 = (uint8_t)uVar7;
          puVar10 = puVar10 + 1;
          uVar9 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  if (this->_oneof_case_[0] == 3) {
    puVar3 = (undefined8 *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "CoreML.Specification.Imputer.imputedStringValue");
    if (this->_oneof_case_[0] == 3) {
      psVar8 = (string *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    }
    else {
      psVar8 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    puVar10 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                        (stream,3,psVar8,puVar10);
  }
  if (this->_oneof_case_[0] == 4) {
    if (stream->end_ <= puVar10) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
    }
    pDVar5 = (this->ImputedValue_).imputeddoublearray_;
    *puVar10 = '\"';
    uVar1 = (pDVar5->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar10[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar10 = puVar10 + 2;
    }
    else {
      puVar10 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar10 + 1);
    }
    puVar10 = DoubleVector::_InternalSerialize(pDVar5,puVar10,stream);
  }
  if (this->_oneof_case_[0] == 5) {
    if (stream->end_ <= puVar10) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
    }
    this_00 = (this->ImputedValue_).imputedint64array_;
    *puVar10 = '*';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar10[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar10 = puVar10 + 2;
    }
    else {
      puVar10 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar10 + 1);
    }
    puVar10 = Int64Vector::_InternalSerialize(this_00,puVar10,stream);
  }
  if (this->_oneof_case_[0] == 6) {
    if (stream->end_ <= puVar10) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
    }
    this_01 = (this->ImputedValue_).imputedstringdictionary_;
    *puVar10 = '2';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar10[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar10 = puVar10 + 2;
    }
    else {
      puVar10 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar10 + 1);
    }
    puVar10 = StringToDoubleMap::_InternalSerialize(this_01,puVar10,stream);
  }
  if (this->_oneof_case_[0] == 7) {
    if (stream->end_ <= puVar10) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
    }
    this_02 = (this->ImputedValue_).imputedint64dictionary_;
    *puVar10 = ':';
    uVar1 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar10[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar10 = puVar10 + 2;
    }
    else {
      puVar10 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar1,puVar10 + 1);
    }
    puVar10 = Int64ToDoubleMap::_InternalSerialize(this_02,puVar10,stream);
  }
  if (this->_oneof_case_[1] == 0xb) {
    if (stream->end_ <= puVar10) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
    }
    if (this->_oneof_case_[1] == 0xb) {
      RVar12 = this->ReplaceValue_;
    }
    else {
      RVar12.replacedoublevalue_ = 0.0;
    }
    *puVar10 = 'Y';
    ((ReplaceValueUnion *)(puVar10 + 1))->replacedoublevalue_ = (double)RVar12;
    puVar10 = puVar10 + 9;
  }
  if (this->_oneof_case_[1] == 0xc) {
    puVar4 = puVar10;
    if (stream->end_ <= puVar10) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar10);
    }
    if (this->_oneof_case_[1] == 0xc) {
      uVar6 = (this->ReplaceValue_).replaceint64value_;
    }
    else {
      uVar6 = 0;
    }
    *puVar4 = '`';
    puVar4[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar10 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar6 | 0x80;
      puVar4[2] = (uint8_t)(uVar6 >> 7);
      puVar10 = puVar4 + 3;
      if (0x3fff < uVar6) {
        uVar9 = (ulong)puVar4[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar10[-1] = (byte)uVar9 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar10 = (uint8_t)uVar7;
          puVar10 = puVar10 + 1;
          uVar9 = uVar7 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
      }
    }
  }
  if (this->_oneof_case_[1] == 0xd) {
    puVar3 = (undefined8 *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "CoreML.Specification.Imputer.replaceStringValue");
    if (this->_oneof_case_[1] == 0xd) {
      psVar8 = (string *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    }
    else {
      psVar8 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    puVar10 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                        (stream,0xd,psVar8,puVar10);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffc) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar3 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar3 = (undefined8 *)((uVar6 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar3[1];
    if ((long)stream->end_ - (long)puVar10 < (long)__n) {
      puVar10 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                          (stream,data,(int)puVar3[1],puVar10);
      return puVar10;
    }
    memcpy(puVar10,data,__n);
    puVar10 = puVar10 + __n;
  }
  return puVar10;
}

Assistant:

uint8_t* Imputer::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Imputer)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double imputedDoubleValue = 1;
  if (_internal_has_imputeddoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(1, this->_internal_imputeddoublevalue(), target);
  }

  // int64 imputedInt64Value = 2;
  if (_internal_has_imputedint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_imputedint64value(), target);
  }

  // string imputedStringValue = 3;
  if (_internal_has_imputedstringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_imputedstringvalue().data(), static_cast<int>(this->_internal_imputedstringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.imputedStringValue");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_imputedstringvalue(), target);
  }

  // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
  if (_internal_has_imputeddoublearray()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::imputeddoublearray(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
  if (_internal_has_imputedint64array()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::imputedint64array(this), target, stream);
  }

  // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
  if (_internal_has_imputedstringdictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::imputedstringdictionary(this), target, stream);
  }

  // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
  if (_internal_has_imputedint64dictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::imputedint64dictionary(this), target, stream);
  }

  // double replaceDoubleValue = 11;
  if (_internal_has_replacedoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_replacedoublevalue(), target);
  }

  // int64 replaceInt64Value = 12;
  if (_internal_has_replaceint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(12, this->_internal_replaceint64value(), target);
  }

  // string replaceStringValue = 13;
  if (_internal_has_replacestringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_replacestringvalue().data(), static_cast<int>(this->_internal_replacestringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.replaceStringValue");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_replacestringvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Imputer)
  return target;
}